

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O0

void rt_pa_set_source_info_and_quit(pa_context *param_1,pa_source_info *i,int eol,void *userdata)

{
  byte bVar1;
  uint uVar2;
  __type _Var3;
  bool bVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  reference pvVar9;
  uint local_19c;
  undefined1 local_128 [8];
  PaDeviceInfo painfo;
  rtaudio_pa_format_mapping_t *fm;
  uint *sr;
  DeviceInfo info;
  ulong local_70;
  size_t n;
  allocator local_51;
  string local_50 [8];
  string name;
  PaDeviceProbeInfo *paProbeInfo;
  void *userdata_local;
  int eol_local;
  pa_source_info *i_local;
  pa_context *param_0_local;
  
  if (eol == 0) {
    pcVar5 = (char *)pa_proplist_gets(i->proplist,"device.description");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar5,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)userdata + 0x58),(value_type *)local_50);
    local_70 = 0;
    while( true ) {
      sVar6 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::size
                        (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                          ((long)userdata + 0x78));
      if (sVar6 <= local_70) break;
      pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                         (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                           ((long)userdata + 0x78),local_70);
      _Var3 = std::operator==(&pvVar7->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50);
      if (_Var3) {
        std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::at
                  (*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_> **)
                    ((long)userdata + 0x70),local_70);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pcVar5 = i->name;
          pvVar9 = std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>
                   ::at(*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>
                          **)((long)userdata + 0x70),local_70);
          std::__cxx11::string::operator=((string *)&pvVar9->sourceName,pcVar5);
          bVar1 = (i->sample_spec).channels;
          pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),local_70);
          pvVar7->inputChannels = (uint)bVar1;
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)userdata + 0x28),i->name);
          pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),local_70);
          pvVar7->isDefaultInput = bVar4;
          pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),local_70);
          uVar2 = pvVar7->inputChannels;
          pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),local_70);
          if (uVar2 < pvVar7->outputChannels) {
            pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                               (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                                  **)((long)userdata + 0x78),local_70);
            local_19c = pvVar7->inputChannels;
          }
          else {
            pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                               (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>
                                  **)((long)userdata + 0x78),local_70);
            local_19c = pvVar7->outputChannels;
          }
          pvVar7 = std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::at
                             (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **
                               )((long)userdata + 0x78),local_70);
          pvVar7->duplexChannels = local_19c;
        }
        info.nativeFormats._4_4_ = 1;
        goto LAB_00129523;
      }
      local_70 = local_70 + 1;
    }
    RtAudio::DeviceInfo::DeviceInfo((DeviceInfo *)&sr);
    std::__cxx11::string::operator=((string *)&info,local_50);
    info._36_4_ = ZEXT14((i->sample_spec).channels);
    info.sampleRates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (i->sample_spec).rate;
    info.inputChannels._1_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)userdata + 0x28),i->name);
    for (fm = (rtaudio_pa_format_mapping_t *)SUPPORTED_SAMPLERATES; (int)fm->rtaudio_format != 0;
        fm = (rtaudio_pa_format_mapping_t *)((long)&fm->rtaudio_format + 4)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&info.duplexChannels,
                 (value_type_conflict *)fm);
    }
    for (painfo._56_8_ = supported_sampleformats; *(long *)painfo._56_8_ != 0;
        painfo._56_8_ = painfo._56_8_ + 0x10) {
      info._80_8_ = *(ulong *)painfo._56_8_ | info._80_8_;
    }
    sr._0_4_ = **(int **)((long)userdata + 0x50);
    **(int **)((long)userdata + 0x50) = (int)sr + 1;
    std::vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>::push_back
              (*(vector<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_> **)
                ((long)userdata + 0x78),(value_type *)&sr);
    RtApiPulse::PaDeviceInfo::PaDeviceInfo((PaDeviceInfo *)local_128);
    std::__cxx11::string::operator=((string *)&painfo.field_0x18,i->name);
    std::vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_>::push_back
              (*(vector<RtApiPulse::PaDeviceInfo,_std::allocator<RtApiPulse::PaDeviceInfo>_> **)
                ((long)userdata + 0x70),(value_type *)local_128);
    RtApiPulse::PaDeviceInfo::~PaDeviceInfo((PaDeviceInfo *)local_128);
    RtAudio::DeviceInfo::~DeviceInfo((DeviceInfo *)&sr);
    info.nativeFormats._4_4_ = 0;
LAB_00129523:
    std::__cxx11::string::~string(local_50);
  }
  else {
    (**(code **)(*userdata + 0x68))(*userdata,0);
  }
  return;
}

Assistant:

static void rt_pa_set_source_info_and_quit( pa_context * /*c*/, const pa_source_info *i,
                                            int eol, void *userdata )
{
  PaDeviceProbeInfo *paProbeInfo = static_cast<PaDeviceProbeInfo *>( userdata );
  if ( eol ) {
    paProbeInfo->paMainLoopApi->quit( paProbeInfo->paMainLoopApi, 0 );
    return;
  }

  std::string name = pa_proplist_gets( i->proplist, "device.description" );
  paProbeInfo->deviceNames.push_back( name );
  for ( size_t n=0; n<paProbeInfo->rtDeviceList->size(); n++ ) {
    if ( paProbeInfo->rtDeviceList->at(n).name == name ) {
      // Check if we've already probed this as an output.
      if ( !paProbeInfo->paDeviceList->at(n).sinkName.empty() ) {
        // This must be a duplex device. Update the device info.
        paProbeInfo->paDeviceList->at(n).sourceName = i->name;
        paProbeInfo->rtDeviceList->at(n).inputChannels = i->sample_spec.channels;
        paProbeInfo->rtDeviceList->at(n).isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
        paProbeInfo->rtDeviceList->at(n).duplexChannels = 
          (paProbeInfo->rtDeviceList->at(n).inputChannels < paProbeInfo->rtDeviceList->at(n).outputChannels)
          ? paProbeInfo->rtDeviceList->at(n).inputChannels : paProbeInfo->rtDeviceList->at(n).outputChannels;
      }
      return; // we already have this
    }
  }

  RtAudio::DeviceInfo info;
  info.name = name;
  info.inputChannels = i->sample_spec.channels;
  info.preferredSampleRate = i->sample_spec.rate;
  info.isDefaultInput = ( paProbeInfo->defaultSourceName == i->name );
  for ( const unsigned int *sr = SUPPORTED_SAMPLERATES; *sr; ++sr )
    info.sampleRates.push_back( *sr );
  for ( const rtaudio_pa_format_mapping_t *fm = supported_sampleformats; fm->rtaudio_format; ++fm )
    info.nativeFormats |= fm->rtaudio_format;
  info.ID = *(paProbeInfo->currentDeviceId);
  *(paProbeInfo->currentDeviceId) = info.ID + 1;
  paProbeInfo->rtDeviceList->push_back( info );

  RtApiPulse::PaDeviceInfo painfo;
  painfo.sourceName = i->name;
  paProbeInfo->paDeviceList->push_back( painfo );
}